

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O0

void __thiscall entities::Label::~Label(Label *this)

{
  Chunk *this_00;
  LodRenderer *pLVar1;
  Chunk *pCVar2;
  Entity *in_RDI;
  LodRenderer *unaff_retaddr;
  Text *in_stack_ffffffffffffffc0;
  Entity *coords;
  
  in_RDI->_vptr_Entity = (_func_int **)&PTR__Label_00493598;
  in_RDI[1]._vptr_Entity = (_func_int **)&DAT_004935d0;
  coords = in_RDI;
  spdlog::debug<char[33]>((char (*) [33])0x282b74);
  this_00 = Entity::getChunk(in_RDI);
  pLVar1 = Chunk::getLodRenderer(this_00);
  if (pLVar1 != (LodRenderer *)0x0) {
    pCVar2 = Entity::getChunk(in_RDI);
    Chunk::getLodRenderer(pCVar2);
    pCVar2 = Entity::getChunk(in_RDI);
    in_stack_ffffffffffffffc0 = (Text *)Chunk::getCoords(pCVar2);
    Entity::getIndex(in_RDI);
    LodRenderer::removeDecoration
              (unaff_retaddr,(repr)coords,(uint)((ulong)in_RDI >> 0x20),(Drawable *)this_00);
  }
  sf::Text::~Text(in_stack_ffffffffffffffc0);
  sf::Drawable::~Drawable((Drawable *)(in_RDI + 1));
  Entity::~Entity(in_RDI);
  return;
}

Assistant:

Label::~Label() {
    spdlog::debug("Label entity has been destroyed.");
    if (getChunk().getLodRenderer() != nullptr) {
        getChunk().getLodRenderer()->removeDecoration(getChunk().getCoords(), getIndex(), this);
    }
}